

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::VerifyIntSpecForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  FunctionJITTimeInfo *pFVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  undefined1 *puVar11;
  undefined **ppuVar12;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  if ((this->field_0xf4 & 2) != 0) {
    return;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    return;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == Mul_I4) {
    bVar3 = IR::Instr::ShouldCheckFor32BitOverflow(instr);
    if ((bVar3) || (bVar3 = IR::Instr::ShouldCheckForNon32BitOverflow(instr), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x37db,
                         "(instr->m_opcode != Js::OpCode::Mul_I4 || (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() ))"
                         ,
                         "instr->m_opcode != Js::OpCode::Mul_I4 || (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() )"
                        );
      if (!bVar3) goto LAB_0044ba37;
      *puVar6 = 0;
    }
    OVar1 = instr->m_opcode;
  }
  if (OVar1 == Ld_A) {
    return;
  }
  if ((OVar1 != Mul_I4 & (instr->field_0x38 & 0x10) >> 4) == 0) {
    if (((instr->m_dst == (Opnd *)0x0) || (instr->m_dst->m_type == TyInt32)) &&
       ((instr->m_src1 == (Opnd *)0x0 || (instr->m_src1->m_type == TyInt32)))) {
      if (instr->m_src2 == (Opnd *)0x0) {
        return;
      }
      if (instr->m_src2->m_type == TyInt32) {
        return;
      }
    }
    if (((instr->field_0x38 & 0x10) == 0) && (bVar3 = IR::Instr::HasAnySideEffects(instr), !bVar3))
    {
      return;
    }
  }
  bVar3 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x37f3,"(!func->IsTrackCompoundedIntOverflowDisabled())",
                       "!func->IsTrackCompoundedIntOverflowDisabled()");
    if (!bVar3) {
LAB_0044ba37:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar7);
  pFVar8 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar8);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar4,uVar5);
  if (bVar3) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar7);
    pFVar8 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_78);
    Output::Print(L"BailOut (compile-time): function: %s (%s) instr: ",pcVar9,pcVar10);
    IR::Instr::Dump(instr);
    Output::Print(L"(overflow does not matter but could not int-spec or needed bailout)\n");
    Output::Flush();
  }
  bVar3 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
  if (bVar3) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar7);
    pFVar8 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar8);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar4,uVar5);
    if (bVar3) {
      Output::Print(L"    Aborting JIT because TrackIntOverflow is already off\n");
      Output::Flush();
    }
    puVar11 = (undefined1 *)__cxa_allocate_exception(1);
    ppuVar12 = &Js::OperationAbortedException::typeinfo;
  }
  else {
    puVar11 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar11 = 6;
    ppuVar12 = &Js::RejitException::typeinfo;
  }
  __cxa_throw(puVar11,ppuVar12,0);
}

Assistant:

void
GlobOpt::VerifyIntSpecForIgnoringIntOverflow(IR::Instr *const instr)
{
    if(intOverflowCurrentlyMattersInRange || IsLoopPrePass())
    {
        return;
    }

    Assert(instr->m_opcode != Js::OpCode::Mul_I4 ||
        (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() ));

    // Instructions that are marked as "overflow doesn't matter" in the range must guarantee that they operate on int values and
    // result in int values, for ignoring overflow to be valid. So, int-specialization is required for such instructions in the
    // range. Ld_A is an exception because it only specializes if the src sym is available as a required specialized sym, and it
    // doesn't generate bailouts or cause ignoring int overflow to be invalid.
    // MULs are allowed to start a region and have BailOutInfo since they will bailout on non-32 bit overflow.
    if(instr->m_opcode == Js::OpCode::Ld_A ||
       ((!instr->HasBailOutInfo() || instr->m_opcode == Js::OpCode::Mul_I4) &&
        (!instr->GetDst() || instr->GetDst()->IsInt32()) &&
        (!instr->GetSrc1() || instr->GetSrc1()->IsInt32()) &&
        (!instr->GetSrc2() || instr->GetSrc2()->IsInt32())))
    {
        return;
    }

    if (!instr->HasBailOutInfo() && !instr->HasAnySideEffects())
    {
        return;
    }

    // This can happen for Neg_A if it needs to bail out on negative zero, and perhaps other cases as well. It's too late to fix
    // the problem (overflows may already be ignored), so handle it by bailing out at compile-time and disabling tracking int
    // overflow.
    Assert(!func->IsTrackCompoundedIntOverflowDisabled());

    if(PHASE_TRACE(Js::BailOutPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("BailOut (compile-time): function: %s (%s) instr: "),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer));
#if DBG_DUMP
        instr->Dump();
#else
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
#endif
        Output::Print(_u("(overflow does not matter but could not int-spec or needed bailout)\n"));
        Output::Flush();
    }

    if(func->IsTrackCompoundedIntOverflowDisabled())
    {
        // Tracking int overflows is already off for some reason. Prevent trying to rejit again because it won't help and the
        // same thing will happen again and cause an infinite loop. Just abort jitting this function.
        if(PHASE_TRACE(Js::BailOutPhase, this->func))
        {
            Output::Print(_u("    Aborting JIT because TrackIntOverflow is already off\n"));
            Output::Flush();
        }
        throw Js::OperationAbortedException();
    }

    throw Js::RejitException(RejitReason::TrackIntOverflowDisabled);
}